

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<double> *f,format_specs *specs,sign s,locale_ref loc)

{
  locale_ref loc_00;
  iterator it;
  bool bVar1;
  char cVar2;
  presentation_type pVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  basic_specs *in_RDX;
  undefined8 *in_RSI;
  buffer<char> *in_RDI;
  undefined8 in_R8;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_20_2_abcdb1c7 use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  char zero;
  int significand_size;
  significand_type significand;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  undefined4 uVar7;
  size_t in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  basic_appender<char> in_stack_fffffffffffffd68;
  basic_appender<char> out_00;
  int local_28c;
  undefined8 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd90;
  undefined2 in_stack_fffffffffffffd94;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffd97;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  locale_ref in_stack_fffffffffffffda0;
  int local_21c;
  buffer<char> local_1c8 [2];
  int local_184;
  int *local_180;
  undefined8 *local_178;
  int *local_170;
  undefined8 *local_168;
  undefined1 *local_160;
  basic_specs *local_158;
  char *local_150;
  int *local_148;
  undefined1 *local_140;
  buffer<char> *local_138;
  undefined8 local_120;
  undefined1 local_118 [64];
  int local_d8;
  int local_d4;
  buffer<char> *local_d0;
  buffer<char> *local_c8;
  buffer<char> *local_c0;
  basic_appender<char> local_b8;
  buffer<char> *local_b0;
  int local_a8;
  undefined8 local_a0;
  int local_98;
  char local_94;
  int local_90;
  undefined1 local_8c;
  undefined1 local_8b;
  int local_88;
  undefined1 local_7d;
  undefined4 local_7c;
  int local_78;
  int local_74;
  basic_specs local_70;
  basic_specs local_68;
  int local_60;
  int local_5c;
  undefined8 local_58;
  char local_49;
  ulong local_48;
  undefined1 local_3d;
  int local_3c;
  undefined8 local_38;
  int local_2c;
  basic_specs *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  buffer<char> *local_10;
  buffer<char> *local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20);
  local_38 = *in_RSI;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_R8;
  local_10 = in_RDI;
  local_3c = get_significand_size<double>((decimal_fp<double> *)0x392e3e);
  local_3d = 0x30;
  mVar4 = to_unsigned<int>(0);
  local_48 = (ulong)(mVar4 + (local_2c != 0));
  bVar1 = basic_specs::localized(local_28);
  if (bVar1) {
    local_58 = local_18;
    loc_00.locale_._4_4_ = in_stack_fffffffffffffd54;
    loc_00.locale_._0_4_ = in_stack_fffffffffffffd50;
    cVar2 = decimal_point<char>(loc_00);
    uVar7 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffd9c);
  }
  else {
    uVar7 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffd9c);
  }
  local_49 = (char)((uint)uVar7 >> 0x18);
  local_60 = *(int *)(local_20 + 1) + local_3c + -1;
  local_70 = *local_28;
  local_68 = local_28[1];
  local_5c = local_60;
  bVar1 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_20_2_abcdb1c7::operator()
                    ((anon_class_20_2_abcdb1c7 *)in_stack_fffffffffffffd68.container);
  if (bVar1) {
    local_74 = 0;
    bVar1 = basic_specs::alt(local_28);
    if (bVar1) {
      local_74 = *(int *)local_28[1].fill_data_ - local_3c;
      if (local_74 < 0) {
        local_74 = 0;
      }
      mVar4 = to_unsigned<int>(0);
      local_48 = mVar4 + local_48;
    }
    else if (local_3c == 1) {
      local_49 = '\0';
    }
    iVar6 = local_5c;
    if (local_5c < 0) {
      iVar6 = -local_5c;
    }
    local_7c = 2;
    if ((99 < iVar6) && (local_7c = 3, 999 < iVar6)) {
      local_7c = 4;
    }
    local_78 = iVar6;
    mVar4 = to_unsigned<int>(0);
    local_48 = mVar4 + local_48;
    bVar1 = basic_specs::upper(local_28);
    uVar8 = 0x65;
    uVar9 = 0x45;
    if (!bVar1) {
      uVar9 = 0x65;
    }
    local_a8 = local_2c;
    local_a0 = local_38;
    local_98 = local_3c;
    local_94 = local_49;
    local_90 = local_74;
    local_8c = 0x30;
    local_88 = local_5c;
    local_8b = uVar9;
    local_7d = uVar9;
    if ((int)local_28[1].data_ < 1) {
      local_b8.container = local_10;
      local_d0 = local_10;
      local_c8 = (buffer<char> *)
                 reserve<char>(in_stack_fffffffffffffd68,
                               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      it.container._4_4_ = uVar7;
      it.container._0_4_ = iVar6;
      local_c0 = (buffer<char> *)
                 do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<double>,_fmt::v11::detail::digit_grouping<char>_>
                 ::anon_class_40_8_fd1bf2f9::operator()
                           ((anon_class_40_8_fd1bf2f9 *)
                            CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(in_stack_fffffffffffffd94,
                                                                   in_stack_fffffffffffffd90))),it);
      local_8 = (buffer<char> *)
                base_iterator<fmt::v11::basic_appender<char>>
                          (local_b8,(basic_appender<char>)local_c0);
    }
    else {
      local_b0 = local_10;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          (in_stack_fffffffffffffd68,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58,
                           (anon_class_40_8_fd1bf2f9 *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    }
  }
  else {
    local_d4 = *(int *)(local_20 + 1) + local_3c;
    if (*(int *)(local_20 + 1) < 0) {
      if (local_d4 < 1) {
        local_21c = -local_d4;
        if (((local_3c == 0) && (-1 < *(int *)local_28[1].fill_data_)) &&
           (*(int *)local_28[1].fill_data_ < local_21c)) {
          local_21c = *(int *)local_28[1].fill_data_;
        }
        uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd54);
        if ((local_21c == 0) && (uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd54), local_3c == 0)
           ) {
          bVar1 = basic_specs::alt(local_28);
          uVar7 = CONCAT13(bVar1,(int3)uVar7);
        }
        iVar6 = ((char)((uint)uVar7 >> 0x18) != '\0') + 1;
        mVar4 = to_unsigned<int>(0);
        local_48 = (iVar6 + mVar4) + local_48;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                            (in_stack_fffffffffffffd68,
                             (format_specs *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                             in_stack_fffffffffffffd58,
                             (anon_class_56_7_88befd79 *)CONCAT44(uVar7,iVar6));
      }
      else {
        bVar1 = basic_specs::alt(local_28);
        if (bVar1) {
          local_28c = *(int *)local_28[1].fill_data_ - local_3c;
        }
        else {
          local_28c = 0;
        }
        local_184 = local_28c;
        iVar5 = max_of<int>(local_28c,0);
        local_48 = local_48 + (iVar5 + 1);
        basic_specs::localized(local_28);
        out_00.container = local_1c8;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)CONCAT44(uVar7,in_stack_fffffffffffffd98),
                   in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd97);
        digit_grouping<char>::count_separators
                  ((digit_grouping<char> *)
                   CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),iVar6);
        mVar4 = to_unsigned<int>(0);
        local_48 = local_48 + mVar4;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                            (out_00,(format_specs *)CONCAT44(mVar4,in_stack_fffffffffffffd60),
                             in_stack_fffffffffffffd58,
                             (anon_class_64_8_085c650e *)
                             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
        digit_grouping<char>::~digit_grouping
                  ((digit_grouping<char> *)
                   CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      }
    }
    else {
      mVar4 = to_unsigned<int>(0);
      local_48 = mVar4 + local_48;
      local_d8 = *(int *)local_28[1].fill_data_ - local_d4;
      abort_fuzzing_if(false);
      bVar1 = basic_specs::alt(local_28);
      if (bVar1) {
        local_48 = local_48 + 1;
        if ((local_d8 < 1) && (pVar3 = basic_specs::type(local_28), pVar3 != fixed)) {
          local_d8 = 0;
        }
        if (0 < local_d8) {
          mVar4 = to_unsigned<int>(0);
          local_48 = mVar4 + local_48;
        }
      }
      local_120 = local_18;
      basic_specs::localized(local_28);
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)CONCAT44(uVar7,in_stack_fffffffffffffd98),
                 in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffd97);
      digit_grouping<char>::count_separators
                ((digit_grouping<char> *)
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),iVar6);
      mVar4 = to_unsigned<int>(0);
      local_48 = local_48 + mVar4;
      local_138 = local_10;
      local_180 = &local_2c;
      local_178 = &local_38;
      local_170 = &local_3c;
      local_168 = local_20;
      local_160 = local_118;
      local_158 = local_28;
      local_150 = &local_49;
      local_148 = &local_d8;
      local_140 = &local_3d;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<double>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                          (in_stack_fffffffffffffd68,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                           in_stack_fffffffffffffd58,
                           (anon_class_72_9_eb40e20e *)
                           CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)
                 CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
    }
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}